

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_DBOpen_Options::_Run(_Test_DBOpen_Options *this)

{
  DB DVar1;
  long *plVar2;
  char *pcVar3;
  size_type *psVar4;
  Status s;
  DB *db;
  string dbname;
  Options opts;
  DB local_278;
  DB *local_270;
  string local_268;
  string local_248;
  void *local_228;
  undefined1 local_220 [24];
  stringstream local_208 [392];
  Options local_80;
  
  test::TmpDir_abi_cxx11_();
  plVar2 = (long *)std::__cxx11::string::append(local_220);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_268.field_2._M_allocated_capacity = *psVar4;
    local_268.field_2._8_8_ = plVar2[3];
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  }
  else {
    local_268.field_2._M_allocated_capacity = *psVar4;
    local_268._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_268._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((Comparator *)local_220._0_8_ != (Comparator *)(local_220 + 0x10)) {
    operator_delete((void *)local_220._0_8_);
  }
  Options::Options((Options *)local_220);
  DestroyDB((leveldb *)&local_228,&local_268,(Options *)local_220);
  if (local_228 != (void *)0x0) {
    operator_delete__(local_228);
  }
  local_270 = (DB *)0x0;
  Options::Options(&local_80);
  local_80._8_2_ = (ushort)local_80.error_if_exists << 8;
  DB::Open(&local_278,&local_80,&local_268,&local_270);
  local_220[0] = 1;
  local_220._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_220._16_4_ = 0x65a;
  std::__cxx11::stringstream::stringstream(local_208);
  Status::ToString_abi_cxx11_(&local_248,(Status *)&local_278);
  pcVar3 = strstr(local_248._M_dataplus._M_p,"does not exist");
  test::Tester::Is((Tester *)local_220,pcVar3 != (char *)0x0,
                   "strstr(s.ToString().c_str(), \"does not exist\") != nullptr");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_220);
  local_220[0] = 1;
  local_220._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_220._16_4_ = 0x65b;
  std::__cxx11::stringstream::stringstream(local_208);
  test::Tester::Is((Tester *)local_220,local_270 == (DB *)0x0,"db == nullptr");
  test::Tester::~Tester((Tester *)local_220);
  local_80.create_if_missing = true;
  DB::Open((DB *)local_220,&local_80,&local_268,&local_270);
  DVar1._vptr_DB = local_278._vptr_DB;
  local_278._vptr_DB = (_func_int **)local_220._0_8_;
  local_220._0_8_ = DVar1._vptr_DB;
  if (DVar1._vptr_DB != (_func_int **)0x0) {
    operator_delete__(DVar1._vptr_DB);
  }
  local_220[0] = true;
  local_220._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_220._16_4_ = 0x660;
  std::__cxx11::stringstream::stringstream(local_208);
  test::Tester::IsOk((Tester *)local_220,(Status *)&local_278);
  test::Tester::~Tester((Tester *)local_220);
  local_220[0] = 1;
  local_220._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_220._16_4_ = 0x661;
  std::__cxx11::stringstream::stringstream(local_208);
  test::Tester::Is((Tester *)local_220,local_270 != (DB *)0x0,"db != nullptr");
  test::Tester::~Tester((Tester *)local_220);
  if (local_270 != (DB *)0x0) {
    (*local_270->_vptr_DB[1])();
  }
  local_270 = (DB *)0x0;
  local_80.create_if_missing = false;
  local_80.error_if_exists = true;
  DB::Open((DB *)local_220,&local_80,&local_268,&local_270);
  DVar1._vptr_DB = local_278._vptr_DB;
  local_278._vptr_DB = (_func_int **)local_220._0_8_;
  local_220._0_8_ = DVar1._vptr_DB;
  if (DVar1._vptr_DB != (_func_int **)0x0) {
    operator_delete__(DVar1._vptr_DB);
  }
  local_220[0] = 1;
  local_220._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_220._16_4_ = 0x66a;
  std::__cxx11::stringstream::stringstream(local_208);
  Status::ToString_abi_cxx11_(&local_248,(Status *)&local_278);
  pcVar3 = strstr(local_248._M_dataplus._M_p,"exists");
  test::Tester::Is((Tester *)local_220,pcVar3 != (char *)0x0,
                   "strstr(s.ToString().c_str(), \"exists\") != nullptr");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test::Tester::~Tester((Tester *)local_220);
  local_220[0] = 1;
  local_220._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_220._16_4_ = 0x66b;
  std::__cxx11::stringstream::stringstream(local_208);
  test::Tester::Is((Tester *)local_220,local_270 == (DB *)0x0,"db == nullptr");
  test::Tester::~Tester((Tester *)local_220);
  local_80.create_if_missing = true;
  local_80.error_if_exists = false;
  DB::Open((DB *)local_220,&local_80,&local_268,&local_270);
  DVar1._vptr_DB = local_278._vptr_DB;
  local_278._vptr_DB = (_func_int **)local_220._0_8_;
  local_220._0_8_ = DVar1._vptr_DB;
  if (DVar1._vptr_DB != (_func_int **)0x0) {
    operator_delete__(DVar1._vptr_DB);
  }
  local_220[0] = true;
  local_220._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_220._16_4_ = 0x671;
  std::__cxx11::stringstream::stringstream(local_208);
  test::Tester::IsOk((Tester *)local_220,(Status *)&local_278);
  test::Tester::~Tester((Tester *)local_220);
  local_220[0] = 1;
  local_220._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_220._16_4_ = 0x672;
  std::__cxx11::stringstream::stringstream(local_208);
  test::Tester::Is((Tester *)local_220,local_270 != (DB *)0x0,"db != nullptr");
  test::Tester::~Tester((Tester *)local_220);
  if (local_270 != (DB *)0x0) {
    (*local_270->_vptr_DB[1])();
  }
  local_270 = (DB *)0x0;
  if (local_278._vptr_DB != (_func_int **)0x0) {
    operator_delete__(local_278._vptr_DB);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(DBTest, DBOpen_Options) {
  std::string dbname = test::TmpDir() + "/db_options_test";
  DestroyDB(dbname, Options());

  // Does not exist, and create_if_missing == false: error
  DB* db = nullptr;
  Options opts;
  opts.create_if_missing = false;
  Status s = DB::Open(opts, dbname, &db);
  ASSERT_TRUE(strstr(s.ToString().c_str(), "does not exist") != nullptr);
  ASSERT_TRUE(db == nullptr);

  // Does not exist, and create_if_missing == true: OK
  opts.create_if_missing = true;
  s = DB::Open(opts, dbname, &db);
  ASSERT_OK(s);
  ASSERT_TRUE(db != nullptr);

  delete db;
  db = nullptr;

  // Does exist, and error_if_exists == true: error
  opts.create_if_missing = false;
  opts.error_if_exists = true;
  s = DB::Open(opts, dbname, &db);
  ASSERT_TRUE(strstr(s.ToString().c_str(), "exists") != nullptr);
  ASSERT_TRUE(db == nullptr);

  // Does exist, and error_if_exists == false: OK
  opts.create_if_missing = true;
  opts.error_if_exists = false;
  s = DB::Open(opts, dbname, &db);
  ASSERT_OK(s);
  ASSERT_TRUE(db != nullptr);

  delete db;
  db = nullptr;
}